

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_counter_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1a7362::DebugCounterTest_DuplicateNamesWorkTogether_Test::
~DebugCounterTest_DuplicateNamesWorkTogether_Test
          (DebugCounterTest_DuplicateNamesWorkTogether_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(DebugCounterTest, DuplicateNamesWorkTogether) {
  EXPECT_EXIT(
      {
        static google::protobuf::internal::RealDebugCounter counter("Foo.Baz");
        CounterOnATemplate<int>();
        CounterOnATemplate<int>();
        CounterOnATemplate<double>();
        counter.Inc();
        counter.Inc();
        exit(0);
      },
      ExitedWithCode(0),
      AllOf(HasSubstr("  Bar       :          3 (60.00%)"),
            HasSubstr("  Baz       :          2 (40.00%)"),
            HasSubstr("  Total     :          5")));
}